

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O3

long testSerializeToStringHeartbeat(int count)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  long lVar3;
  timeval tv;
  Heartbeat message;
  long *local_1b8 [2];
  long local_1a8 [2];
  timeval local_198;
  Heartbeat local_188;
  
  FIX42::Heartbeat::Heartbeat(&local_188);
  gettimeofday(&local_198,(__timezone_ptr_t)0x0);
  _Var2 = local_198.tv_usec;
  _Var1 = local_198.tv_sec;
  if (0 < count) {
    do {
      FIX::Message::toString_abi_cxx11_((int)local_1b8,(int)&local_188,8);
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0],local_1a8[0] + 1);
      }
      count = count + -1;
    } while (count != 0);
  }
  lVar3 = SUB168(SEXT816(_Var2) * SEXT816(-0x20c49ba5e353f7cf),8);
  gettimeofday(&local_198,(__timezone_ptr_t)0x0);
  FIX::Message::~Message((Message *)&local_188);
  return (local_198.tv_sec - _Var1) * 1000 +
         local_198.tv_usec / 1000 + ((lVar3 >> 7) - (lVar3 >> 0x3f));
}

Assistant:

long testSerializeToStringHeartbeat( int count )
{
  FIX42::Heartbeat message;
  count = count - 1;

  long start = GetTickCount();
  for ( int i = 0; i <= count; ++i )
  {
    message.toString();
  }
  return GetTickCount() - start;
}